

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleID>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleID> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  const_reference pvVar1;
  uint *puVar2;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [24];
  deUint32 sampleID;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  deUint32 sampleNdx;
  deUint32 numSamples;
  ConstPixelBufferAccess *dataRS_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *dataPerSample_local;
  VkImageCreateInfo *imageRSInfo_local;
  VkImageCreateInfo *imageMSInfo_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceSampleID> *this_local;
  
  z = imageMSInfo->samples;
  y = 0;
  _sampleNdx = dataRS;
  dataRS_local = (ConstPixelBufferAccess *)dataPerSample;
  dataPerSample_local =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
       imageRSInfo;
  imageRSInfo_local = imageMSInfo;
  imageMSInfo_local = (VkImageCreateInfo *)this;
  this_local = (MSInstance<vkt::pipeline::multisample::MSInstanceSampleID> *)__return_storage_ptr__;
  do {
    if (z <= y) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Passed",&local_b9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      return __return_storage_ptr__;
    }
    for (x = 0; x < (imageRSInfo_local->extent).depth; x = x + 1) {
      for (sampleID = 0; sampleID < (imageRSInfo_local->extent).height; sampleID = sampleID + 1) {
        for (local_60._20_4_ = 0; (uint)local_60._20_4_ < (imageRSInfo_local->extent).width;
            local_60._20_4_ = local_60._20_4_ + 1) {
          pvVar1 = std::
                   vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 *)dataRS_local,(ulong)y);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_60,(int)pvVar1,local_60._20_4_,sampleID);
          puVar2 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_60);
          local_60._16_4_ = *puVar2;
          if (local_60._16_4_ != y) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"gl_SampleID does not have correct value",&local_81);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            std::allocator<char>::~allocator(&local_81);
            return __return_storage_ptr__;
          }
        }
      }
    }
    y = y + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleID>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																			 const vk::VkImageCreateInfo&						imageRSInfo,
																			 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																			 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	DE_UNREF(imageRSInfo);
	DE_UNREF(dataRS);

	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
	{
		for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
		for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
		for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
		{
			const deUint32 sampleID = dataPerSample[sampleNdx].getPixelUint(x, y, z).x();

			if (sampleID != sampleNdx)
				return tcu::TestStatus::fail("gl_SampleID does not have correct value");
		}
	}

	return tcu::TestStatus::pass("Passed");
}